

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void nuts_tran_listener_cancel(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  nng_socket local_28;
  nng_listener local_24;
  nng_socket s;
  nng_listener l;
  
  local_28.id = 0;
  local_24.id = 0;
  pcVar4 = strchr(scheme,0x36);
  if (pcVar4 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x139,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_listener_cancel::nuts_addr_);
  nVar2 = nng_pair1_open(&local_28);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x13b,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar4,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_listen(local_28,nuts_tran_listener_cancel::nuts_addr_,&local_24,0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x13c,"%s: expected success, got %s (%d)","nng_listen(s, addr, &l, 0)",
                           pcVar4,nVar2);
    if (iVar3 != 0) {
      iVar3 = nng_listener_id(local_24);
      acutest_check_((uint)(0 < iVar3),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x13d,"%s","nng_listener_id(l) > 0");
      nVar2 = nng_listener_close(local_24);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x13e,"%s: expected success, got %s (%d)","nng_listener_close(l)",
                             pcVar4,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_close(local_28);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x13f,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                               pcVar4,nVar2);
        if (iVar3 != 0) {
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_listener_cancel(const char *scheme)
{
	nng_socket   s = NNG_SOCKET_INITIALIZER;
	nng_listener l = NNG_LISTENER_INITIALIZER;
	const char  *addr;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s);
	NUTS_PASS(nng_listen(s, addr, &l, 0));
	NUTS_TRUE(nng_listener_id(l) > 0);
	NUTS_PASS(nng_listener_close(l));
	NUTS_CLOSE(s);
}